

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O3

dgVector __thiscall dgMatrix::CalcPitchYawRoll(dgMatrix *this)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  dgVector dVar12;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  fVar7 = (this->m_front).super_dgTemplateVector<float>.m_z;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(ZEXT416((uint)fVar7),auVar6);
  uVar1 = vcmpss_avx512f(SUB6416(ZEXT464(0x3f7fffef),0),ZEXT416((uint)fVar7),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar7),SUB6416(ZEXT464(0xbf7fffef),0),1);
  bVar3 = (bool)((byte)uVar1 & 1);
  fVar7 = asinf((float)((uint)bVar3 * 0x3f7fffef +
                       (uint)!bVar3 * ((uint)bVar2 * -0x40800011 + (uint)!bVar2 * auVar6._0_4_)));
  if (0x7f7fffff < (uint)ABS(fVar7)) {
    __assert_fail("(isfinite(yaw) && !isnan(yaw))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                  ,0x110,"dgVector dgMatrix::CalcPitchYawRoll() const");
  }
  fVar8 = (this->m_front).super_dgTemplateVector<float>.m_z;
  if (0.99995 <= fVar8) {
    auVar10._0_4_ =
         atan2f((this->m_up).super_dgTemplateVector<float>.m_x,
                (this->m_up).super_dgTemplateVector<float>.m_y);
    auVar10._4_60_ = extraout_var_00;
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar6 = vpxord_avx512vl(auVar10._0_16_,auVar4);
  }
  else {
    if (-0.99995 < fVar8) {
      fVar8 = atan2f((this->m_front).super_dgTemplateVector<float>.m_y,
                     (this->m_front).super_dgTemplateVector<float>.m_x);
      auVar9._0_4_ = atan2f((this->m_up).super_dgTemplateVector<float>.m_z,
                            (this->m_right).super_dgTemplateVector<float>.m_z);
      auVar9._4_60_ = extraout_var;
      auVar6 = auVar9._0_16_;
      goto LAB_0085897c;
    }
    auVar11._0_4_ =
         atan2f((this->m_up).super_dgTemplateVector<float>.m_x,
                (this->m_up).super_dgTemplateVector<float>.m_y);
    auVar11._4_60_ = extraout_var_01;
    auVar6 = auVar11._0_16_;
  }
  fVar8 = 0.0;
LAB_0085897c:
  auVar5._4_4_ = extraout_XMM0_Db;
  auVar5._0_4_ = fVar7;
  auVar5._8_4_ = extraout_XMM0_Dc;
  auVar5._12_4_ = extraout_XMM0_Dd;
  if (((!NAN(fVar8)) && ((auVar6._0_4_ & 0x7fffffff) < 0x7f800000)) &&
     ((uint)ABS(fVar8) < 0x7f800000)) {
    auVar6 = vinsertps_avx(auVar6,auVar5,0x10);
    dVar12.super_dgTemplateVector<float>._0_8_ = auVar6._0_8_;
    dVar12.super_dgTemplateVector<float>.m_z = fVar8;
    dVar12.super_dgTemplateVector<float>.m_w = 0.0;
    return (dgVector)dVar12.super_dgTemplateVector<float>;
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

dgVector dgMatrix::CalcPitchYawRoll () const
{
	const hacd::HaF32 minSin = hacd::HaF32(0.99995f);

	const dgMatrix& matrix = *this;

	hacd::HaF32 roll = hacd::HaF32(0.0f);
	hacd::HaF32 pitch  = hacd::HaF32(0.0f);
	hacd::HaF32 yaw = dgAsin (-ClampValue (matrix[0][2], hacd::HaF32(-0.999999f), hacd::HaF32(0.999999f)));

	HACD_ASSERT (dgCheckFloat (yaw));
	if (matrix[0][2] < minSin) {
		if (matrix[0][2] > (-minSin)) {
			roll = dgAtan2 (matrix[0][1], matrix[0][0]);
			pitch = dgAtan2 (matrix[1][2], matrix[2][2]);
		} else {
			pitch = dgAtan2 (matrix[1][0], matrix[1][1]);
		}
	} else {
		pitch = -dgAtan2 (matrix[1][0], matrix[1][1]);
	}

#ifdef _DEBUG
	dgMatrix m (dgPitchMatrix (pitch) * dgYawMatrix(yaw) * dgRollMatrix(roll));
	for (hacd::HaI32 i = 0; i < 3; i ++) {
		for (hacd::HaI32 j = 0; j < 3; j ++) {
			hacd::HaF32 error = dgAbsf (m[i][j] - matrix[i][j]);
			HACD_ASSERT (error < 5.0e-2f);
		}
	}
#endif

	return dgVector (pitch, yaw, roll, hacd::HaF32(0.0f));
}